

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O1

int32 ngram_model_add_class_word(ngram_model_t *model,char *classname,char *word,float32 weight)

{
  int *piVar1;
  byte bVar2;
  int iVar3;
  ngram_class_t *lmclass;
  int32 *piVar4;
  ngram_hash_s *pnVar5;
  int32 iVar6;
  int iVar7;
  char *fmt;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  double p;
  
  iVar6 = ngram_wid(model,classname);
  if (iVar6 == -1) {
    fmt = "No such word or class tag: %s\n";
    lVar10 = 0x318;
  }
  else {
    bVar2 = model->n_classes;
    if (bVar2 == 0) {
      uVar9 = 0;
    }
    else {
      uVar8 = 0;
      do {
        uVar9 = uVar8;
        if (model->classes[uVar8]->tag_wid == iVar6) break;
        uVar8 = uVar8 + 1;
        uVar9 = (ulong)bVar2;
      } while (bVar2 != uVar8);
    }
    if ((uint)uVar9 != (uint)bVar2) {
      lmclass = model->classes[uVar9 & 0xffffffff];
      iVar6 = ngram_add_word_internal(model,word,(uint)uVar9);
      if (iVar6 == -1) {
        return -1;
      }
      p = (double)((float)weight / (float)(lmclass->n_words + lmclass->n_hash_inuse + 1));
      iVar7 = logmath_log(model->lmath,(float64)(1.0 - p));
      if (0 < lmclass->n_words) {
        piVar4 = lmclass->prob1;
        lVar10 = 0;
        do {
          piVar4[lVar10] = piVar4[lVar10] + iVar7;
          lVar10 = lVar10 + 1;
        } while (lVar10 < lmclass->n_words);
      }
      iVar3 = lmclass->n_hash;
      if (0 < (long)iVar3) {
        pnVar5 = lmclass->nword_hash;
        lVar10 = 0;
        do {
          if (*(int *)((long)&pnVar5->wid + lVar10) != -1) {
            piVar1 = (int *)((long)&pnVar5->prob1 + lVar10);
            *piVar1 = *piVar1 + iVar7;
          }
          lVar10 = lVar10 + 0xc;
        } while ((long)iVar3 * 0xc != lVar10);
      }
      iVar7 = logmath_log(model->lmath,(float64)p);
      iVar6 = ngram_class_add_word(lmclass,iVar6,iVar7);
      return iVar6;
    }
    fmt = "Word %s is not a class tag (call ngram_model_add_class() first)\n";
    lVar10 = 0x323;
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
          ,lVar10,fmt,classname);
  return -1;
}

Assistant:

int32
ngram_model_add_class_word(ngram_model_t * model,
                           const char *classname,
                           const char *word, float32 weight)
{
    ngram_class_t *lmclass;
    int32 classid, tag_wid, wid, i, scale;
    float32 fprob;

    /* Find the class corresponding to classname.  Linear search
     * probably okay here since there won't be very many classes, and
     * this doesn't have to be fast. */
    tag_wid = ngram_wid(model, classname);
    if (tag_wid == NGRAM_INVALID_WID) {
        E_ERROR("No such word or class tag: %s\n", classname);
        return tag_wid;
    }
    for (classid = 0; classid < model->n_classes; ++classid) {
        if (model->classes[classid]->tag_wid == tag_wid)
            break;
    }
    /* Hmm, no such class.  It's probably not a good idea to create one. */
    if (classid == model->n_classes) {
        E_ERROR
            ("Word %s is not a class tag (call ngram_model_add_class() first)\n",
             classname);
        return NGRAM_INVALID_WID;
    }
    lmclass = model->classes[classid];

    /* Add this word to the model's set of words. */
    wid = ngram_add_word_internal(model, word, classid);
    if (wid == NGRAM_INVALID_WID)
        return wid;

    /* This is the fixed probability of the new word. */
    fprob = weight * 1.0f / (lmclass->n_words + lmclass->n_hash_inuse + 1);
    /* Now normalize everything else to fit it in.  This is
     * accomplished by simply scaling all the other probabilities
     * by (1-fprob). */
    scale = logmath_log(model->lmath, 1.0 - fprob);
    for (i = 0; i < lmclass->n_words; ++i)
        lmclass->prob1[i] += scale;
    for (i = 0; i < lmclass->n_hash; ++i)
        if (lmclass->nword_hash[i].wid != -1)
            lmclass->nword_hash[i].prob1 += scale;

    /* Now add it to the class hash table. */
    return ngram_class_add_word(lmclass, wid,
                                logmath_log(model->lmath, fprob));
}